

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O1

void __thiscall
GenericSectionImport_TextBadDataType_Test::~GenericSectionImport_TextBadDataType_Test
          (GenericSectionImport_TextBadDataType_Test *this)

{
  (this->super_GenericSectionImport).super_Test._vptr_Test =
       (_func_int **)&PTR__GenericSectionImport_0023fc18;
  pstore::database::~database(&(this->super_GenericSectionImport).db_);
  in_memory_store::~in_memory_store(&(this->super_GenericSectionImport).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (GenericSectionImport, TextBadDataType) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The data value is a boolean rather than a string.
    auto const & parser = parse<pstore::repo::section_kind::text> (
        R"({ "align":8, "data":true })", &db_, pstore::exchange::import_ns::string_mapping{},
        &inserter, &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
}